

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O2

void __thiscall HVectorBase<double>::tight(HVectorBase<double> *this)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  int iVar5;
  long lVar6;
  size_t my_index;
  HighsInt i;
  long lVar7;
  int iVar8;
  
  iVar5 = this->count;
  if (iVar5 < 0) {
    pdVar3 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar7 = 0; (long)pdVar4 - (long)pdVar3 >> 3 != lVar7; lVar7 = lVar7 + 1) {
      if (ABS(pdVar3[lVar7]) < 1e-14) {
        pdVar3[lVar7] = 0.0;
      }
    }
  }
  else {
    piVar2 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = 0;
    for (lVar7 = 0; lVar7 < iVar5; lVar7 = lVar7 + 1) {
      iVar1 = piVar2[lVar7];
      if (1e-14 <= ABS(pdVar3[iVar1])) {
        lVar6 = (long)iVar8;
        iVar8 = iVar8 + 1;
        piVar2[lVar6] = iVar1;
        iVar5 = this->count;
      }
      else {
        pdVar3[iVar1] = 0.0;
      }
    }
    this->count = iVar8;
  }
  return;
}

Assistant:

void HVectorBase<Real>::tight() {
  /*
   * Zero values in Vector.array that do not exceed kHighsTiny in
   * magnitude, maintaining index if it is well defined
   */
  HighsInt totalCount = 0;
  using std::abs;
  if (count < 0) {
    for (size_t my_index = 0; my_index < array.size(); my_index++)
      if (abs(array[my_index]) < kHighsTiny) array[my_index] = 0;
  } else {
    for (HighsInt i = 0; i < count; i++) {
      const HighsInt my_index = index[i];
      const Real& value = array[my_index];
      if (abs(value) >= kHighsTiny) {
        index[totalCount++] = my_index;
      } else {
        array[my_index] = Real{0};
      }
    }
    count = totalCount;
  }
}